

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall Sampling_Logistic_Test::TestBody(Sampling_Logistic_Test *this)

{
  undefined1 auVar1 [16];
  float fVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float *pfVar5;
  size_t sVar6;
  Allocator AVar7;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  undefined1 auVar10 [16];
  Float FVar11;
  Float FVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  span<const_float> f;
  Float b;
  Float a;
  AssertHelper local_180;
  Float s;
  AssertionResult gtest_ar_;
  Float dp;
  Float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  Float local_13c;
  AssertionResult gtest_ar;
  AssertHelper local_110;
  _Any_data local_108;
  code *pcStack_f8;
  code *pcStack_f0;
  Uniform1DIter __begin2;
  IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter> local_d0 [2];
  undefined8 local_c8;
  undefined8 local_c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Uniform1DIter __end2;
  PiecewiseConstant1D distrib;
  undefined1 extraout_var [60];
  
  for (lVar8 = 0; lVar8 != 0x24; lVar8 = lVar8 + 0xc) {
    s = *(Float *)((long)&DAT_0052d980 + lVar8);
    FVar11 = *(Float *)((long)&DAT_0052d984 + lVar8);
    b = *(Float *)((long)&DAT_0052d988 + lVar8);
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    pcStack_f8 = (code *)0x0;
    pcStack_f0 = (code *)0x0;
    a = FVar11;
    local_158 = b;
    local_108._M_unused._M_object = operator_new(0x18);
    *(Float **)local_108._M_unused._0_8_ = &s;
    *(Float **)((long)local_108._M_unused._0_8_ + 8) = &a;
    *(Float **)((long)local_108._M_unused._0_8_ + 0x10) = &b;
    pcStack_f0 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:814:25)>
                 ::_M_invoke;
    pcStack_f8 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:814:25)>
                 ::_M_manager;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&values,(function<float_(float)> *)&local_108,0x2000,0x10,FVar11,local_158,AVar7);
    std::_Function_base::~_Function_base((_Function_base *)&local_108);
    sVar6 = values.nStored;
    pfVar5 = values.ptr;
    FVar11 = a;
    local_158 = b;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar6;
    f.ptr = pfVar5;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&distrib,f,FVar11,local_158,AVar7);
    local_d0[0].n = 100;
    local_c8 = 0;
    local_c0 = 0x853c49e6748fea9b;
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::begin
              (&__begin2,local_d0);
    pbrt::detail::IndexingGenerator<pbrt::Uniform1D,_pbrt::detail::Uniform1DIter>::end
              (&__end2,local_d0);
    for (; __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i !=
           __end2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
           super_IndexingIterator<pbrt::detail::Uniform1DIter>.i;
        __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
        super_IndexingIterator<pbrt::detail::Uniform1DIter>.i =
             __begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.
             super_IndexingIterator<pbrt::detail::Uniform1DIter>.i + 1) {
      local_158 = pbrt::RNG::Uniform<float>
                            (&__begin2.super_RNGIterator<pbrt::detail::Uniform1DIter>.rng);
      uStack_154 = extraout_XMM0_Db;
      uStack_150 = extraout_XMM0_Dc;
      uStack_14c = extraout_XMM0_Dd;
      FVar11 = pbrt::SampleTrimmedLogistic(local_158,s,a,b);
      FVar12 = pbrt::TrimmedLogisticPDF(FVar11,s,a,b);
      local_13c = pbrt::PiecewiseConstant1D::Sample(&distrib,local_158,&dp,(int *)0x0);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f689374bc6a7e;
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(FVar11 - local_13c)),auVar10);
      local_180.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cx - dx)","3e-3",(float *)&local_180,
                 (double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),FVar11);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),local_13c);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x338,pcVar9);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0x3f689374bc6a7e;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar10 = vandps_avx512vl(ZEXT416((uint)(FVar12 - dp)),auVar1);
      local_180.data_._0_4_ = auVar10._0_4_;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&gtest_ar,"std::abs(cp - dp)","3e-3",(float *)&local_180,
                 (double *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Closed form PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),FVar12);
        std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),", distrib PDF = ");
        std::ostream::operator<<((void *)(gtest_ar_._0_8_ + 0x10),dp);
        pcVar9 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x33a,pcVar9);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      auVar13._0_4_ = pbrt::InvertTrimmedLogisticSample(FVar11,s,a,b);
      auVar13._4_60_ = extraout_var;
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar4._4_4_ = uStack_154;
      auVar4._0_4_ = local_158;
      auVar4._8_4_ = uStack_150;
      auVar4._12_4_ = uStack_14c;
      auVar10 = vandps_avx(auVar4,auVar14);
      auVar1 = vandps_avx(auVar13._0_16_,auVar14);
      auVar10 = vminss_avx(auVar1,auVar10);
      fVar2 = local_158 - auVar13._0_4_;
      bVar3 = auVar10._0_4_ < 0.01;
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      auVar10 = vandps_avx(ZEXT416((uint)bVar3 * (int)fVar2 +
                                   (uint)!bVar3 *
                                   (int)((fVar2 + fVar2) / (local_158 + auVar13._0_4_))),auVar14);
      gtest_ar_.success_ = auVar10._0_4_ <= 0.01;
      if (0.01 < auVar10._0_4_) {
        testing::Message::Message((Message *)&local_180);
        std::operator<<((ostream *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),
                        "u = ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),local_158)
        ;
        std::operator<<((ostream *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),
                        " -> x = ");
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),FVar11);
        std::operator<<((ostream *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),
                        " -> ... ");
        FVar11 = pbrt::InvertTrimmedLogisticSample(FVar11,s,a,b);
        std::ostream::operator<<
                  ((void *)(CONCAT44(local_180.data_._4_4_,local_180.data_._0_4_) + 0x10),FVar11);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b))","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x345,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_180);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_180);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    pbrt::PiecewiseConstant1D::~PiecewiseConstant1D(&distrib);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&values);
  }
  return;
}

Assistant:

TEST(Sampling, Logistic) {
    Float params[][3] = {{1., -Pi, Pi}, {5, 0, 3}, {.25, -5, -3}};
    for (const auto p : params) {
        Float s = p[0], a = p[1], b = p[2];
        auto logistic = [&](Float v) { return TrimmedLogistic(v, s, a, b); };

        auto values = Sample1DFunction(logistic, 8192, 16, a, b);
        PiecewiseConstant1D distrib(values, a, b);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedLogistic(u, s, a, b);
            Float cp = TrimmedLogisticPDF(cx, s, a, b);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 3e-3)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedLogisticSample(cx, s, a, b);
        }
    }
}